

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.h
# Opt level: O3

void __thiscall
dlib::bn_<(dlib::layer_mode)0>::
setup<dlib::dimpl::subnet_wrapper<dlib::add_layer<dlib::con_<256l,1l,1l,1,1,0,0>,dlib::add_tag_layer<1ul,dlib::impl::repeat_input_layer,void>,void>,true,void>>
          (bn_<(dlib::layer_mode)0> *this,
          subnet_wrapper<dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_true,_void>
          *sub)

{
  alias_tensor *this_00;
  uint *puVar1;
  long lVar2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  size_t new_size;
  byte bVar20;
  int iVar21;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar22;
  ushort uVar23;
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  alias_tensor_instance local_70;
  
  this_00 = &this->gamma;
  lVar2 = (sub->l->cached_output).super_tensor.m_k;
  (this->gamma).inst.super_tensor.m_n = 1;
  (this->gamma).inst.super_tensor.m_k = lVar2;
  (this->gamma).inst.super_tensor.m_nr = 1;
  (this->gamma).inst.super_tensor.m_nc = 1;
  (this->gamma).inst.super_tensor.m_size = lVar2;
  (this->gamma).inst.data_instance = (gpu_data *)0x0;
  (this->gamma).inst._annotation = (any *)0x0;
  (this->gamma).inst.data_offset = 0;
  (this->beta).inst.super_tensor.m_size = lVar2;
  new_size = lVar2 * 2;
  (this->beta).inst.super_tensor.m_n = (this->gamma).inst.super_tensor.m_n;
  (this->beta).inst.super_tensor.m_k = (this->gamma).inst.super_tensor.m_k;
  (this->beta).inst.super_tensor.m_nr = (this->gamma).inst.super_tensor.m_nr;
  (this->beta).inst.super_tensor.m_nc = (this->gamma).inst.super_tensor.m_nc;
  (this->beta).inst.data_instance = (gpu_data *)0x0;
  (this->beta).inst._annotation = (any *)0x0;
  (this->beta).inst.data_offset = 0;
  (this->params).super_tensor.m_n = new_size;
  (this->params).super_tensor.m_k = 1;
  (this->params).super_tensor.m_nr = 1;
  (this->params).super_tensor.m_nc = 1;
  (this->params).super_tensor.m_size = new_size;
  sVar3 = (this->params).data_instance.data_size;
  if (SBORROW8(sVar3,new_size) != (long)(sVar3 + lVar2 * -2) < 0) {
    gpu_data::set_size(&(this->params).data_instance,new_size);
  }
  alias_tensor::operator()(&local_70,this_00,(tensor *)this,0);
  iVar21 = (*local_70.super_tensor._vptr_tensor[4])(&local_70);
  if (local_70.super_tensor.m_size != 0) {
    auVar24 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    auVar25 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar26 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar27 = vpbroadcastq_avx512f();
    uVar22 = 0;
    do {
      auVar28 = vpbroadcastq_avx512f();
      auVar29 = vporq_avx512f(auVar28,auVar25);
      auVar28 = vporq_avx512f(auVar28,auVar26);
      uVar18 = vpcmpuq_avx512f(auVar28,auVar27,2);
      uVar19 = vpcmpuq_avx512f(auVar29,auVar27,2);
      bVar20 = (byte)uVar19;
      uVar23 = CONCAT11(bVar20,(byte)uVar18);
      puVar1 = (uint *)(CONCAT44(extraout_var,iVar21) + uVar22 * 4);
      bVar4 = (bool)((byte)uVar18 & 1);
      bVar5 = (bool)((byte)(uVar23 >> 1) & 1);
      bVar6 = (bool)((byte)(uVar23 >> 2) & 1);
      bVar7 = (bool)((byte)(uVar23 >> 3) & 1);
      bVar8 = (bool)((byte)(uVar23 >> 4) & 1);
      bVar9 = (bool)((byte)(uVar23 >> 5) & 1);
      bVar10 = (bool)((byte)(uVar23 >> 6) & 1);
      bVar11 = (bool)((byte)(uVar23 >> 7) & 1);
      bVar12 = (bool)(bVar20 >> 1 & 1);
      bVar13 = (bool)(bVar20 >> 2 & 1);
      bVar14 = (bool)(bVar20 >> 3 & 1);
      bVar15 = (bool)(bVar20 >> 4 & 1);
      bVar16 = (bool)(bVar20 >> 5 & 1);
      bVar17 = (bool)(bVar20 >> 6 & 1);
      *puVar1 = (uint)bVar4 * auVar24._0_4_ | (uint)!bVar4 * *puVar1;
      puVar1[1] = (uint)bVar5 * auVar24._4_4_ | (uint)!bVar5 * puVar1[1];
      puVar1[2] = (uint)bVar6 * auVar24._8_4_ | (uint)!bVar6 * puVar1[2];
      puVar1[3] = (uint)bVar7 * auVar24._12_4_ | (uint)!bVar7 * puVar1[3];
      puVar1[4] = (uint)bVar8 * auVar24._16_4_ | (uint)!bVar8 * puVar1[4];
      puVar1[5] = (uint)bVar9 * auVar24._20_4_ | (uint)!bVar9 * puVar1[5];
      puVar1[6] = (uint)bVar10 * auVar24._24_4_ | (uint)!bVar10 * puVar1[6];
      puVar1[7] = (uint)bVar11 * auVar24._28_4_ | (uint)!bVar11 * puVar1[7];
      puVar1[8] = (uint)(bVar20 & 1) * auVar24._32_4_ | (uint)!(bool)(bVar20 & 1) * puVar1[8];
      puVar1[9] = (uint)bVar12 * auVar24._36_4_ | (uint)!bVar12 * puVar1[9];
      puVar1[10] = (uint)bVar13 * auVar24._40_4_ | (uint)!bVar13 * puVar1[10];
      puVar1[0xb] = (uint)bVar14 * auVar24._44_4_ | (uint)!bVar14 * puVar1[0xb];
      puVar1[0xc] = (uint)bVar15 * auVar24._48_4_ | (uint)!bVar15 * puVar1[0xc];
      puVar1[0xd] = (uint)bVar16 * auVar24._52_4_ | (uint)!bVar16 * puVar1[0xd];
      puVar1[0xe] = (uint)bVar17 * auVar24._56_4_ | (uint)!bVar17 * puVar1[0xe];
      puVar1[0xf] = (uint)(bVar20 >> 7) * auVar24._60_4_ | (uint)!(bool)(bVar20 >> 7) * puVar1[0xf];
      uVar22 = uVar22 + 0x10;
    } while ((local_70.super_tensor.m_size + 0xfU & 0xfffffffffffffff0) != uVar22);
  }
  alias_tensor::operator()
            (&local_70,&this->beta,(tensor *)this,(this->gamma).inst.super_tensor.m_size);
  iVar21 = (*local_70.super_tensor._vptr_tensor[4])(&local_70);
  if (local_70.super_tensor.m_size != 0) {
    memset((void *)CONCAT44(extraout_var_00,iVar21),0,local_70.super_tensor.m_size << 2);
  }
  alias_tensor::operator()(&local_70,this_00,(tensor *)this,0);
  resizable_tensor::copy_size(&this->running_means,&local_70.super_tensor);
  alias_tensor::operator()(&local_70,this_00,(tensor *)this,0);
  resizable_tensor::copy_size(&this->running_variances,&local_70.super_tensor);
  iVar21 = (*(this->running_means).super_tensor._vptr_tensor[4])(&this->running_means);
  lVar2 = (this->running_means).super_tensor.m_size;
  if (lVar2 != 0) {
    memset((void *)CONCAT44(extraout_var_01,iVar21),0,lVar2 << 2);
  }
  iVar21 = (*(this->running_variances).super_tensor._vptr_tensor[4])(&this->running_variances);
  lVar2 = (this->running_variances).super_tensor.m_size;
  if (lVar2 != 0) {
    auVar24 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    auVar25 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar26 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar27 = vpbroadcastq_avx512f();
    uVar22 = 0;
    do {
      auVar28 = vpbroadcastq_avx512f();
      auVar29 = vporq_avx512f(auVar28,auVar25);
      auVar28 = vporq_avx512f(auVar28,auVar26);
      uVar18 = vpcmpuq_avx512f(auVar28,auVar27,2);
      uVar19 = vpcmpuq_avx512f(auVar29,auVar27,2);
      bVar20 = (byte)uVar19;
      uVar23 = CONCAT11(bVar20,(byte)uVar18);
      puVar1 = (uint *)(CONCAT44(extraout_var_02,iVar21) + uVar22 * 4);
      bVar4 = (bool)((byte)uVar18 & 1);
      bVar5 = (bool)((byte)(uVar23 >> 1) & 1);
      bVar6 = (bool)((byte)(uVar23 >> 2) & 1);
      bVar7 = (bool)((byte)(uVar23 >> 3) & 1);
      bVar8 = (bool)((byte)(uVar23 >> 4) & 1);
      bVar9 = (bool)((byte)(uVar23 >> 5) & 1);
      bVar10 = (bool)((byte)(uVar23 >> 6) & 1);
      bVar11 = (bool)((byte)(uVar23 >> 7) & 1);
      bVar12 = (bool)(bVar20 >> 1 & 1);
      bVar13 = (bool)(bVar20 >> 2 & 1);
      bVar14 = (bool)(bVar20 >> 3 & 1);
      bVar15 = (bool)(bVar20 >> 4 & 1);
      bVar16 = (bool)(bVar20 >> 5 & 1);
      bVar17 = (bool)(bVar20 >> 6 & 1);
      *puVar1 = (uint)bVar4 * auVar24._0_4_ | (uint)!bVar4 * *puVar1;
      puVar1[1] = (uint)bVar5 * auVar24._4_4_ | (uint)!bVar5 * puVar1[1];
      puVar1[2] = (uint)bVar6 * auVar24._8_4_ | (uint)!bVar6 * puVar1[2];
      puVar1[3] = (uint)bVar7 * auVar24._12_4_ | (uint)!bVar7 * puVar1[3];
      puVar1[4] = (uint)bVar8 * auVar24._16_4_ | (uint)!bVar8 * puVar1[4];
      puVar1[5] = (uint)bVar9 * auVar24._20_4_ | (uint)!bVar9 * puVar1[5];
      puVar1[6] = (uint)bVar10 * auVar24._24_4_ | (uint)!bVar10 * puVar1[6];
      puVar1[7] = (uint)bVar11 * auVar24._28_4_ | (uint)!bVar11 * puVar1[7];
      puVar1[8] = (uint)(bVar20 & 1) * auVar24._32_4_ | (uint)!(bool)(bVar20 & 1) * puVar1[8];
      puVar1[9] = (uint)bVar12 * auVar24._36_4_ | (uint)!bVar12 * puVar1[9];
      puVar1[10] = (uint)bVar13 * auVar24._40_4_ | (uint)!bVar13 * puVar1[10];
      puVar1[0xb] = (uint)bVar14 * auVar24._44_4_ | (uint)!bVar14 * puVar1[0xb];
      puVar1[0xc] = (uint)bVar15 * auVar24._48_4_ | (uint)!bVar15 * puVar1[0xc];
      puVar1[0xd] = (uint)bVar16 * auVar24._52_4_ | (uint)!bVar16 * puVar1[0xd];
      puVar1[0xe] = (uint)bVar17 * auVar24._56_4_ | (uint)!bVar17 * puVar1[0xe];
      puVar1[0xf] = (uint)(bVar20 >> 7) * auVar24._60_4_ | (uint)!(bool)(bVar20 >> 7) * puVar1[0xf];
      uVar22 = uVar22 + 0x10;
    } while ((lVar2 + 0xfU & 0xfffffffffffffff0) != uVar22);
  }
  this->num_updates = 0;
  return;
}

Assistant:

void setup (const SUBNET& sub)
        {
            if (mode == FC_MODE)
            {
                gamma = alias_tensor(1,
                                sub.get_output().k(),
                                sub.get_output().nr(),
                                sub.get_output().nc());
            }
            else
            {
                gamma = alias_tensor(1, sub.get_output().k());
            }
            beta = gamma;

            params.set_size(gamma.size()+beta.size());

            gamma(params,0) = 1;
            beta(params,gamma.size()) = 0;

            running_means.copy_size(gamma(params,0));
            running_variances.copy_size(gamma(params,0));
            running_means = 0;
            running_variances = 1;
            num_updates = 0;
        }